

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

void __thiscall QFileSystemModelPrivate::rebuildNameFilterRegexps(QFileSystemModelPrivate *this)

{
  uint uVar1;
  pointer pQVar2;
  pointer pQVar3;
  long lVar4;
  QString *pQVar5;
  long lVar6;
  pointer this_00;
  long in_FS_OFFSET;
  QRegularExpression local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar3 = (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pQVar2;
  if (pQVar3 != pQVar2) {
    do {
      QRegularExpression::~QRegularExpression(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pQVar3);
    (this->nameFiltersRegexps).
    super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar2;
  }
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::reserve
            (&this->nameFiltersRegexps,(this->nameFilters).d.size);
  lVar4 = (this->nameFilters).d.size;
  if (lVar4 != 0) {
    uVar1 = (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
            super_QFlagsStorage<QDir::Filter>.i;
    pQVar5 = (this->nameFilters).d.ptr;
    lVar6 = 0;
    do {
      QRegularExpression::fromWildcard
                (&local_40,*(undefined8 *)((long)&(pQVar5->d).size + lVar6),
                 *(undefined8 *)((long)&(pQVar5->d).ptr + lVar6),uVar1 >> 0xb & 1,0);
      std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::
      emplace_back<QRegularExpression>(&this->nameFiltersRegexps,&local_40);
      QRegularExpression::~QRegularExpression(&local_40);
      lVar6 = lVar6 + 0x18;
    } while (lVar4 * 0x18 != lVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::rebuildNameFilterRegexps()
{
    nameFiltersRegexps.clear();
    nameFiltersRegexps.reserve(nameFilters.size());
    const auto cs = (filters & QDir::CaseSensitive) ? Qt::CaseSensitive : Qt::CaseInsensitive;
    const auto convertWildcardToRegexp = [cs](const QString &nameFilter)
    {
        return QRegularExpression::fromWildcard(nameFilter, cs);
    };
    std::transform(nameFilters.constBegin(),
                   nameFilters.constEnd(),
                   std::back_inserter(nameFiltersRegexps),
                   convertWildcardToRegexp);
}